

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O3

void __thiscall xs::posix::PipeReader::start(PipeReader *this,deFile *file)

{
  deBool dVar1;
  Error *this_00;
  
  dVar1 = deFile_setFlags(file,1);
  if (dVar1 != 0) {
    this->m_file = file;
    de::Thread::start(&this->super_Thread);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this_00,"Failed to set non-blocking mode","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsPosixTestProcess.cpp"
               ,0x72);
  __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PipeReader::start (deFile* file)
{
	DE_ASSERT(!isStarted());

	// Set to non-blocking mode.
	if (!deFile_setFlags(file, DE_FILE_NONBLOCKING))
		XS_FAIL("Failed to set non-blocking mode");

	m_file = file;

	de::Thread::start();
}